

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O2

bool __thiscall pbrt::Point3fi::IsExact(Point3fi *this)

{
  float fVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  
  if ((((this->super_Point3<pbrt::Interval<float>_>).
        super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high -
        (this->super_Point3<pbrt::Interval<float>_>).
        super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low == 0.0) &&
      (fVar1 = (this->super_Point3<pbrt::Interval<float>_>).
               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high -
               (this->super_Point3<pbrt::Interval<float>_>).
               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low, fVar1 == 0.0)) &&
     (!NAN(fVar1))) {
    auVar3._0_12_ = ZEXT812(0);
    auVar3._12_4_ = 0;
    uVar2 = vcmpss_avx512f(ZEXT416((uint)((this->super_Point3<pbrt::Interval<float>_>).
                                          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high
                                         - (this->super_Point3<pbrt::Interval<float>_>).
                                           super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low)
                                  ),auVar3,0);
    return (bool)((byte)uVar2 & 1);
  }
  return false;
}

Assistant:

PBRT_CPU_GPU
    Float Width() const { return high - low; }